

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O3

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
          (UnorderedElementsAreMatcherImplBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchMatrix *matrix,MatchResultListener *listener)

{
  byte *pbVar1;
  size_t sVar2;
  MatcherDescriberInterface *pMVar3;
  pointer pbVar4;
  void *pvVar5;
  MatchResultListener *pMVar6;
  ulong uVar7;
  pointer pcVar8;
  pointer ppMVar9;
  pointer pcVar10;
  pointer ppMVar11;
  Flags FVar12;
  ulong uVar13;
  size_t sVar14;
  bool bVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  char *sep;
  vector<char,_std::allocator<char>_> element_matched;
  vector<char,_std::allocator<char>_> matcher_matched;
  char *local_78;
  undefined1 local_70 [24];
  pointer local_58;
  vector<char,_std::allocator<char>_> local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  sVar14 = matrix->num_elements_;
  sVar2 = matrix->num_matchers_;
  bVar15 = true;
  if (sVar14 != 0 || sVar2 != 0) {
    bVar18 = this->match_flags_ != ExactMatch;
    bVar15 = sVar14 == sVar2 || bVar18;
    local_38 = element_printouts;
    if (sVar14 != 0 && (sVar14 != sVar2 && !bVar18)) {
      if (listener->stream_ != (ostream *)0x0) {
        pMVar6 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
        Elements((UnorderedElementsAreMatcherImplBase *)local_70,matrix->num_elements_);
        pMVar6 = MatchResultListener::operator<<(pMVar6,(Message *)local_70);
        MatchResultListener::operator<<(pMVar6,(char (*) [2])0x21f49e);
        if ((pointer)local_70._0_8_ != (pointer)0x0) {
          (*(code *)(*(MatcherDescriberInterface **)local_70._0_8_)[1].
                    _vptr_MatcherDescriberInterface)();
        }
        sVar14 = matrix->num_elements_;
      }
      bVar15 = false;
    }
    local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start._0_1_ = 0;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_70,sVar14,(value_type *)&local_50,
               (allocator_type *)&local_78);
    local_78 = (char *)((ulong)local_78 & 0xffffffffffffff00);
    std::vector<char,_std::allocator<char>_>::vector
              (&local_50,matrix->num_matchers_,(value_type *)&local_78,(allocator_type *)&local_58);
    sVar14 = matrix->num_elements_;
    if (sVar14 != 0) {
      uVar16 = matrix->num_matchers_;
      uVar7 = 0;
      do {
        if (uVar16 == 0) {
          uVar16 = 0;
        }
        else {
          uVar13 = 0;
          do {
            bVar18 = (matrix->matched_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13 + uVar16 * uVar7] == '\x01';
            *(byte *)(local_70._0_8_ + uVar7) = *(byte *)(local_70._0_8_ + uVar7) | bVar18;
            pbVar1 = (byte *)(CONCAT71(local_50.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_50.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar13);
            *pbVar1 = *pbVar1 | bVar18;
            uVar13 = uVar13 + 1;
            uVar16 = matrix->num_matchers_;
          } while (uVar13 < uVar16);
          sVar14 = matrix->num_elements_;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < sVar14);
    }
    FVar12 = this->match_flags_;
    if ((FVar12 & Superset) != 0) {
      local_78 = "where the following matchers don\'t match any elements:\n";
      pcVar8 = (pointer)CONCAT71(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start._1_7_,
                                 local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start._0_1_);
      if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish != pcVar8) {
        uVar16 = 0;
        pcVar10 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        do {
          if (pcVar8[uVar16] == '\0') {
            if (listener->stream_ != (ostream *)0x0) {
              pMVar6 = MatchResultListener::operator<<(listener,&local_78);
              pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [10])0x21bf8e);
              if (pMVar6->stream_ != (ostream *)0x0) {
                std::ostream::_M_insert<unsigned_long>((ulong)pMVar6->stream_);
              }
              MatchResultListener::operator<<(pMVar6,(char (*) [3])0x21f835);
              pMVar3 = (this->matcher_describers_).
                       super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16];
              (*pMVar3->_vptr_MatcherDescriberInterface[2])(pMVar3,listener->stream_);
              local_78 = ",\n";
              pcVar8 = (pointer)CONCAT71(local_50.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                                         local_50.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_1_);
              pcVar10 = local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            bVar15 = false;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < (ulong)((long)pcVar10 - (long)pcVar8));
        FVar12 = this->match_flags_;
      }
    }
    if ((FVar12 & Subset) != 0) {
      local_78 = "where the following elements don\'t match any matchers:\n";
      local_58 = (pointer)0x21beb9;
      if (bVar15) {
        local_58 = (pointer)0x21f49f;
      }
      if (local_70._8_8_ != local_70._0_8_) {
        lVar17 = 8;
        uVar16 = 0;
        ppMVar9 = (pointer)local_70._0_8_;
        ppMVar11 = (pointer)local_70._8_8_;
        do {
          if (*(char *)((long)ppMVar9 + uVar16) == '\0') {
            if (listener->stream_ != (ostream *)0x0) {
              pMVar6 = MatchResultListener::operator<<(listener,(char **)&local_58);
              pMVar6 = MatchResultListener::operator<<(pMVar6,&local_78);
              pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [10])0x21bd44);
              if (pMVar6->stream_ != (ostream *)0x0) {
                std::ostream::_M_insert<unsigned_long>((ulong)pMVar6->stream_);
              }
              pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [3])0x21f835);
              if (pMVar6->stream_ != (ostream *)0x0) {
                pbVar4 = (local_38->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pMVar6->stream_,*(char **)((long)pbVar4 + lVar17 + -8),
                           *(long *)((long)&(pbVar4->_M_dataplus)._M_p + lVar17));
              }
              local_78 = ",\n";
              local_58 = (pointer)0x21f49f;
              ppMVar9 = (pointer)local_70._0_8_;
              ppMVar11 = (pointer)local_70._8_8_;
            }
            bVar15 = false;
          }
          uVar16 = uVar16 + 1;
          lVar17 = lVar17 + 0x20;
        } while (uVar16 < (ulong)((long)ppMVar11 - (long)ppMVar9));
      }
    }
    pvVar5 = (void *)CONCAT71(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start._1_7_,
                              local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start._0_1_);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,(long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
    }
    if ((pointer)local_70._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ - local_70._0_8_);
    }
  }
  return bVar15;
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix(
    const ::std::vector<std::string>& element_printouts,
    const MatchMatrix& matrix, MatchResultListener* listener) const {
  if (matrix.LhsSize() == 0 && matrix.RhsSize() == 0) {
    return true;
  }

  const bool is_exact_match_with_size_discrepency =
      match_flags() == UnorderedMatcherRequire::ExactMatch &&
      matrix.LhsSize() != matrix.RhsSize();
  if (is_exact_match_with_size_discrepency) {
    // The element count doesn't match.  If the container is empty,
    // there's no need to explain anything as Google Mock already
    // prints the empty container. Otherwise we just need to show
    // how many elements there actually are.
    if (matrix.LhsSize() != 0 && listener->IsInterested()) {
      *listener << "which has " << Elements(matrix.LhsSize()) << "\n";
    }
  }

  bool result = !is_exact_match_with_size_discrepency;
  ::std::vector<char> element_matched(matrix.LhsSize(), 0);
  ::std::vector<char> matcher_matched(matrix.RhsSize(), 0);

  for (size_t ilhs = 0; ilhs < matrix.LhsSize(); ilhs++) {
    for (size_t irhs = 0; irhs < matrix.RhsSize(); irhs++) {
      char matched = matrix.HasEdge(ilhs, irhs);
      element_matched[ilhs] |= matched;
      matcher_matched[irhs] |= matched;
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Superset) {
    const char* sep =
        "where the following matchers don't match any elements:\n";
    for (size_t mi = 0; mi < matcher_matched.size(); ++mi) {
      if (matcher_matched[mi]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << sep << "matcher #" << mi << ": ";
        matcher_describers_[mi]->DescribeTo(listener->stream());
        sep = ",\n";
      }
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Subset) {
    const char* sep =
        "where the following elements don't match any matchers:\n";
    const char* outer_sep = "";
    if (!result) {
      outer_sep = "\nand ";
    }
    for (size_t ei = 0; ei < element_matched.size(); ++ei) {
      if (element_matched[ei]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << outer_sep << sep << "element #" << ei << ": "
                  << element_printouts[ei];
        sep = ",\n";
        outer_sep = "";
      }
    }
  }
  return result;
}